

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<float,_3,_3> *
tcu::rotationMatrixY(Matrix<float,_3,_3> *__return_storage_ptr__,float radiansY)

{
  float fVar1;
  float fVar2;
  float local_c;
  
  local_c = 1.0;
  Matrix<float,_3,_3>::Matrix(__return_storage_ptr__,&local_c);
  fVar1 = cosf(radiansY);
  fVar2 = sinf(radiansY);
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = fVar1;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = fVar2;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = -fVar2;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = fVar1;
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<float, 3, 3> rotationMatrixY (float radiansY)
{
	Matrix<float, 3, 3> mat(1.0f);
	float				c	= deFloatCos(radiansY);
	float				s	= deFloatSin(radiansY);

	mat(0, 0) = c;
	mat(0, 2) = s;
	mat(2, 0) = -s;
	mat(2, 2) = c;

	return mat;
}